

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O0

void deqp::gles3::Functional::checkFboAttachmentParam
               (TestContext *testCtx,Context *ctx,GLenum attachment,GLenum pname,GLint expectedValue
               )

{
  MessageBuilder *pMVar1;
  GLint value_00;
  string local_4f8;
  MessageBuilder local_4d8;
  MessageBuilder local_358;
  int local_1d8;
  uint local_1d4;
  GLenum err;
  GLint value;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  TestLog *local_30;
  TestLog *log;
  GLenum local_20;
  GLint expectedValue_local;
  GLenum pname_local;
  GLenum attachment_local;
  Context *ctx_local;
  TestContext *testCtx_local;
  
  log._4_4_ = expectedValue;
  local_20 = pname;
  expectedValue_local = attachment;
  _pname_local = ctx;
  ctx_local = (Context *)testCtx;
  local_30 = tcu::TestContext::getLog(testCtx);
  tcu::TestLog::operator<<(&local_1b0,local_30,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [13])"// Querying ");
  local_1c8[0] = getAttachmentName(expectedValue_local);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1c8);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2c7b4d6);
  _err = getAttachmentParameterName(local_20);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char **)&err);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  local_1d4 = 0xcdcdcdcd;
  (*_pname_local->_vptr_Context[0x22])
            (_pname_local,0x8d40,(ulong)(uint)expectedValue_local,(ulong)local_20,&local_1d4);
  local_1d8 = (*_pname_local->_vptr_Context[0x79])();
  if ((local_1d4 == log._4_4_) && (local_1d8 == 0)) {
    tcu::TestLog::operator<<(&local_358,local_30,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_358,(char (*) [8])"// Pass");
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
  }
  else {
    tcu::TestLog::operator<<(&local_4d8,local_30,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_4d8,(char (*) [19])"// Fail, expected ");
    getAttachmentParameterValueName_abi_cxx11_(&local_4f8,(Functional *)(ulong)log._4_4_,value_00);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_4f8);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [15])" without error");
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_4f8);
    tcu::MessageBuilder::~MessageBuilder(&local_4d8);
    tcu::TestContext::setTestResult
              ((TestContext *)ctx_local,QP_TEST_RESULT_FAIL,
               "Invalid result for attachment param query");
  }
  return;
}

Assistant:

static void checkFboAttachmentParam (tcu::TestContext& testCtx, sglr::Context& ctx, GLenum attachment, GLenum pname, GLint expectedValue)
{
	TestLog& log = testCtx.getLog();
	log << TestLog::Message << "// Querying " << getAttachmentName(attachment) << " " << getAttachmentParameterName(pname) << TestLog::EndMessage;

	GLint value = 0xcdcdcdcd;
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachment, pname, &value);

	GLenum err = ctx.getError();

	if (value == expectedValue && err == GL_NO_ERROR)
		log << TestLog::Message << "// Pass" << TestLog::EndMessage;
	else
	{
		log << TestLog::Message << "// Fail, expected " << getAttachmentParameterValueName(expectedValue) << " without error" << TestLog::EndMessage;
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid result for attachment param query");
	}
}